

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixtls.cpp
# Opt level: O1

void exitRoutine(void)

{
  HoardHeapType *pHVar1;
  HeapManager<HL::SpinLockType,_Hoard::HoardHeap<2048,_128>_> *this;
  ThreadLocalAllocationBuffer<15,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getSizeClass,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getClassSize,_1024UL,_16777216UL,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_262144U,_Hoard::HoardHeapType>
  *this_00;
  long *in_FS_OFFSET;
  
  this_00 = (ThreadLocalAllocationBuffer<15,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getSizeClass,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getClassSize,_1024UL,_16777216UL,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_262144U,_Hoard::HoardHeapType>
             *)*in_FS_OFFSET;
  if (this_00 ==
      (ThreadLocalAllocationBuffer<15,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getSizeClass,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getClassSize,_1024UL,_16777216UL,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_262144U,_Hoard::HoardHeapType>
       *)0x0) {
    this_00 = (ThreadLocalAllocationBuffer<15,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getSizeClass,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getClassSize,_1024UL,_16777216UL,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_262144U,_Hoard::HoardHeapType>
               *)*in_FS_OFFSET;
    pHVar1 = getMainHoardHeap();
    in_FS_OFFSET[0x10] = (long)pHVar1;
    in_FS_OFFSET[0x11] = 0;
    in_FS_OFFSET[0x12] = 0;
    in_FS_OFFSET[0x13] = 0;
    in_FS_OFFSET[0x14] = 0;
    in_FS_OFFSET[0x15] = 0;
    in_FS_OFFSET[0x16] = 0;
    in_FS_OFFSET[0x17] = 0;
    in_FS_OFFSET[0x18] = 0;
    in_FS_OFFSET[0x19] = 0;
    in_FS_OFFSET[0x1a] = 0;
    in_FS_OFFSET[0x1b] = 0;
    in_FS_OFFSET[0x1c] = 0;
    in_FS_OFFSET[0x1d] = 0;
    in_FS_OFFSET[0x1e] = 0;
    in_FS_OFFSET[0x1f] = 0;
    in_FS_OFFSET[0x20] = 0;
    *in_FS_OFFSET = (long)this_00;
  }
  this = &getMainHoardHeap()->super_HeapManager<HL::SpinLockType,_Hoard::HoardHeap<2048,_128>_>;
  Hoard::HeapManager<HL::SpinLockType,_Hoard::HoardHeap<2048,_128>_>::releaseHeap(this);
  Hoard::
  ThreadLocalAllocationBuffer<15,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getSizeClass,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getClassSize,_1024UL,_16777216UL,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_262144U,_Hoard::HoardHeapType>
  ::clear(this_00);
  return;
}

Assistant:

static TheCustomHeapType * initializeCustomHeap() {
  auto tlab = theTLAB;
  if (tlab == nullptr) {
    new (reinterpret_cast<char *>(&tlabBuffer)) TheCustomHeapType(getMainHoardHeap());
    tlab = reinterpret_cast<TheCustomHeapType *>(&tlabBuffer);
    theTLAB = tlab;
  }
  return tlab;
}